

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::GetTllSignatureTraces(cmTarget *this,ostream *s,TLLSignature sig)

{
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  pointer ppVar2;
  ostream *poVar3;
  cmState *this_00;
  string *top;
  char *pcVar4;
  pointer ppVar5;
  cmListFileContext lfc;
  string local_50;
  
  pcVar4 = "plain";
  if (sig == KeywordTLLSignature) {
    pcVar4 = "keyword";
  }
  poVar3 = std::operator<<(s,"The uses of the ");
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::operator<<(poVar3," signature are here:\n");
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  ppVar2 = *(pointer *)((long)&(_Var1._M_head_impl)->TLLCommands + 8);
  for (ppVar5 = *(pointer *)
                 &((_Var1._M_head_impl)->TLLCommands).
                  super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
      ; ppVar5 != ppVar2; ppVar5 = ppVar5 + 1) {
    if (ppVar5->first == sig) {
      cmListFileContext::cmListFileContext(&lfc,&ppVar5->second);
      this_00 = cmMakefile::GetState
                          (((this->impl)._M_t.
                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                            .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                           Makefile);
      top = cmState::GetSourceDirectory_abi_cxx11_(this_00);
      cmSystemTools::RelativeIfUnder(&local_50,top,&lfc.FilePath);
      std::__cxx11::string::operator=((string *)&lfc.FilePath,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      poVar3 = std::operator<<(s," * ");
      poVar3 = operator<<(poVar3,&lfc);
      std::operator<<(poVar3,'\n');
      cmListFileContext::~cmListFileContext(&lfc);
    }
  }
  return;
}

Assistant:

void cmTarget::GetTllSignatureTraces(std::ostream& s, TLLSignature sig) const
{
  const char* sigString =
    (sig == cmTarget::KeywordTLLSignature ? "keyword" : "plain");
  s << "The uses of the " << sigString << " signature are here:\n";
  for (auto const& cmd : this->impl->TLLCommands) {
    if (cmd.first == sig) {
      cmListFileContext lfc = cmd.second;
      lfc.FilePath = cmSystemTools::RelativeIfUnder(
        this->impl->Makefile->GetState()->GetSourceDirectory(), lfc.FilePath);
      s << " * " << lfc << '\n';
    }
  }
}